

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

void raviX_set_remove(Set *set,void *key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t hash;
  SetEntry *pSVar3;
  undefined1 auVar4 [16];
  
  hash = (*set->hash_function)(key);
  pSVar3 = raviX_set_search_pre_hashed(set,hash,key);
  if (pSVar3 != (SetEntry *)0x0) {
    pSVar3->key = &deleted_key_value;
    uVar1 = set->entries;
    uVar2 = set->deleted_entries;
    auVar4._4_4_ = uVar2;
    auVar4._0_4_ = uVar1;
    auVar4._8_8_ = 0;
    auVar4 = vpaddd_avx(auVar4,_DAT_00134cb0);
    set->entries = (int)auVar4._0_8_;
    set->deleted_entries = (int)((ulong)auVar4._0_8_ >> 0x20);
  }
  return;
}

Assistant:

void raviX_set_remove(Set *set, const void *key)
{
	SetEntry *entry;

	entry = raviX_set_search(set, key);

	raviX_set_remove_entry(set, entry);
}